

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O1

void Sfm_CreateFanout(Vec_Wec_t *vFanins,Vec_Wec_t *vFanouts)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  void *pvVar7;
  long lVar8;
  size_t __size;
  long lVar9;
  
  iVar2 = vFanins->nSize;
  if (vFanouts->nCap < iVar2) {
    __size = (long)iVar2 << 4;
    if (vFanouts->pArray == (Vec_Int_t *)0x0) {
      pVVar6 = (Vec_Int_t *)malloc(__size);
    }
    else {
      pVVar6 = (Vec_Int_t *)realloc(vFanouts->pArray,__size);
    }
    vFanouts->pArray = pVVar6;
    memset(pVVar6 + vFanouts->nCap,0,((long)iVar2 - (long)vFanouts->nCap) * 0x10);
    vFanouts->nCap = iVar2;
  }
  vFanouts->nSize = iVar2;
  iVar3 = vFanins->nSize;
  if (0 < (long)iVar3) {
    pVVar6 = vFanins->pArray;
    lVar8 = 0;
    do {
      if (0 < pVVar6[lVar8].nSize) {
        piVar5 = pVVar6[lVar8].pArray;
        lVar9 = 0;
        do {
          iVar4 = piVar5[lVar9];
          if (((long)iVar4 < 0) || (iVar2 <= iVar4)) goto LAB_004d9d21;
          piVar1 = &vFanouts->pArray[iVar4].nSize;
          *piVar1 = *piVar1 + 1;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar6[lVar8].nSize);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar3);
  }
  if (0 < vFanouts->nSize) {
    lVar9 = 8;
    lVar8 = 0;
    do {
      pVVar6 = vFanouts->pArray;
      iVar2 = *(int *)((long)pVVar6 + lVar9 + -4);
      *(undefined4 *)((long)pVVar6 + lVar9 + -4) = 0;
      if (*(int *)((long)pVVar6 + lVar9 + -8) < iVar2) {
        pvVar7 = *(void **)((long)&pVVar6->nCap + lVar9);
        if (pvVar7 == (void *)0x0) {
          pvVar7 = malloc((long)iVar2 << 2);
        }
        else {
          pvVar7 = realloc(pvVar7,(long)iVar2 << 2);
        }
        *(void **)((long)&pVVar6->nCap + lVar9) = pvVar7;
        if (pvVar7 == (void *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *(int *)((long)pVVar6 + lVar9 + -8) = iVar2;
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < vFanouts->nSize);
  }
  if (0 < vFanins->nSize) {
    lVar8 = 0;
    do {
      pVVar6 = vFanins->pArray;
      if (0 < pVVar6[lVar8].nSize) {
        lVar9 = 0;
        do {
          iVar2 = pVVar6[lVar8].pArray[lVar9];
          if (((long)iVar2 < 0) || (vFanouts->nSize <= iVar2)) {
LAB_004d9d21:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(vFanouts->pArray + iVar2,(int)lVar8);
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar6[lVar8].nSize);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < vFanins->nSize);
  }
  if (0 < (long)vFanouts->nSize) {
    lVar8 = 0;
    do {
      if (*(int *)((long)&vFanouts->pArray->nSize + lVar8) !=
          *(int *)((long)&vFanouts->pArray->nCap + lVar8)) {
        __assert_fail("Vec_IntSize(vArray) == Vec_IntCap(vArray)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/sfm/sfmNtk.c"
                      ,0x61,"void Sfm_CreateFanout(Vec_Wec_t *, Vec_Wec_t *)");
      }
      lVar8 = lVar8 + 0x10;
    } while ((long)vFanouts->nSize * 0x10 != lVar8);
  }
  return;
}

Assistant:

void Sfm_CreateFanout( Vec_Wec_t * vFanins, Vec_Wec_t * vFanouts )
{
    Vec_Int_t * vArray;
    int i, k, Fanin;
    // count fanouts
    Vec_WecInit( vFanouts, Vec_WecSize(vFanins) );
    Vec_WecForEachLevel( vFanins, vArray, i )
        Vec_IntForEachEntry( vArray, Fanin, k )
            Vec_WecEntry( vFanouts, Fanin )->nSize++;
    // allocate fanins
    Vec_WecForEachLevel( vFanouts, vArray, i )
    {
        k = vArray->nSize; vArray->nSize = 0;
        Vec_IntGrow( vArray, k );
    }
    // add fanouts
    Vec_WecForEachLevel( vFanins, vArray, i )
        Vec_IntForEachEntry( vArray, Fanin, k )
            Vec_IntPush( Vec_WecEntry( vFanouts, Fanin ), i );
    // verify
    Vec_WecForEachLevel( vFanouts, vArray, i )
        assert( Vec_IntSize(vArray) == Vec_IntCap(vArray) );
}